

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_parse_end_of_frame(lws *wsi)

{
  uint8_t uVar1;
  lws_h2_netconn *plVar2;
  int iVar3;
  lws *plVar4;
  char *pcVar5;
  lws_filepos_t lVar6;
  uchar *puVar7;
  lws_h2_protocol_send *plVar8;
  lws *local_160;
  lws *w;
  lws_h2_protocol_send *pps_1;
  uchar *c;
  char buf [256];
  int len;
  int n_1;
  lws_h2_protocol_send *pps;
  int n;
  char *p;
  lws *eff_wsi;
  lws_h2_netconn *h2n;
  lws *wsi_local;
  
  plVar2 = (wsi->h2).h2n;
  plVar2->frame_state = '\0';
  plVar2->count = 0;
  if (plVar2->sid != 0) {
    plVar4 = lws_wsi_mux_from_id(wsi,plVar2->sid);
    plVar2->swsi = plVar4;
  }
  if (plVar2->highest_sid < plVar2->sid) {
    plVar2->highest_sid = plVar2->sid;
  }
  if (((*(ushort *)&plVar2->field_0xa8 >> 7 & 1) != 0) &&
     ((plVar2->dep & 0x7fffffff) == plVar2->sid)) {
    lws_h2_goaway(wsi,1,"depends on own sid");
    return 0;
  }
  switch(plVar2->type) {
  case '\0':
    _lws_log(8,"%s: DATA flags 0x%x\n","lws_h2_parse_end_of_frame",(ulong)plVar2->flags);
    if (plVar2->swsi != (lws *)0x0) {
      iVar3 = lws_hdr_total_length(plVar2->swsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
      if (((iVar3 == 0) || (((plVar2->swsi->h2).field_0x11 & 1) == 0)) ||
         (((plVar2->swsi->http).rx_content_length == 0 ||
          ((plVar2->swsi->http).rx_content_remain == 0)))) {
        if ((((plVar2->swsi->h2).field_0x11 & 1) != 0) && ((plVar2->swsi->h2).h2_state == '\x03')) {
          lws_h2_state(plVar2->swsi,LWS_H2_STATE_HALF_CLOSED_REMOTE);
        }
        if ((((plVar2->swsi->h2).field_0x11 & 1) != 0) && ((plVar2->swsi->h2).h2_state == '\x05')) {
          lws_h2_state(plVar2->swsi,LWS_H2_STATE_CLOSED);
        }
        if (((*(ulong *)&plVar2->swsi->field_0x2dc >> 0x37 & 1) != 0) && ((plVar2->flags & 1) != 0))
        {
          _lws_log(8,"%s: %p: DATA: end stream\n","lws_h2_parse_end_of_frame",plVar2->swsi);
          if ((plVar2->swsi->h2).h2_state == '\x03') {
            lws_h2_state(plVar2->swsi,LWS_H2_STATE_HALF_CLOSED_REMOTE);
          }
          lws_h2_state(plVar2->swsi,LWS_H2_STATE_CLOSED);
          lws_h2_rst_stream(plVar2->swsi,0,"client done");
          iVar3 = lws_http_transaction_completed_client(plVar2->swsi);
          if (iVar3 != 0) {
            _lws_log(0x10,"tx completed returned close\n");
          }
        }
      }
      else {
        lws_h2_rst_stream(plVar2->swsi,1,"Not enough rx content");
      }
    }
    break;
  case '\x01':
  case '\t':
    if (plVar2->swsi == (lws *)0x0) {
      return 0;
    }
    if ((*(ushort *)&plVar2->field_0xa8 >> 10 & 1) != 0) {
      lws_h2_goaway(wsi,9,"dyntable resize last in headers");
      return 0;
    }
    if (((byte)(plVar2->swsi->h2).field_0x11 >> 1 & 1) == 0) {
      _lws_log(8,"witholding http action for continuation\n");
      plVar2->cont_exp_sid = plVar2->sid;
      *(ushort *)&plVar2->field_0xa8 = *(ushort *)&plVar2->field_0xa8 & 0xfff7 | 8;
      return 0;
    }
    if (plVar2->hpack != HPKS_TYPE) {
      _lws_log(8,"hpack incomplete %d (type %d, len %u)\n",(ulong)plVar2->hpack,(ulong)plVar2->type,
               (ulong)plVar2->hpack_len);
      lws_h2_goaway(wsi,9,"hpack incomplete");
      return 0;
    }
    uVar1 = (plVar2->swsi->h2).h2_state;
    if (uVar1 == '\0') {
      lws_h2_state(plVar2->swsi,LWS_H2_STATE_OPEN);
    }
    else if (uVar1 == '\x02') {
      lws_h2_state(plVar2->swsi,LWS_H2_STATE_HALF_CLOSED_LOCAL);
    }
    _lws_log(8,"http req, wsi=%p, h2n->swsi=%p\n",wsi,plVar2->swsi);
    *(ulong *)&plVar2->swsi->field_0x2dc =
         *(ulong *)&plVar2->swsi->field_0x2dc & 0xfffffffffffffffe | 1;
    if (((*(ulong *)&plVar2->swsi->field_0x2dc >> 0x37 & 1) != 0) &&
       (iVar3 = lws_client_interpret_server_handshake(plVar2->swsi), iVar3 != 0)) {
      _lws_log(8,"%s: cli int serv hs closed it\n","lws_h2_parse_end_of_frame");
      return 0;
    }
    iVar3 = lws_hdr_extant(plVar2->swsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
    if (iVar3 != 0) {
      pcVar5 = lws_hdr_simple_ptr(plVar2->swsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
      lVar6 = atoll(pcVar5);
      (plVar2->swsi->http).rx_content_length = lVar6;
      (plVar2->swsi->http).rx_content_remain = (plVar2->swsi->http).rx_content_length;
      _lws_log(8,"setting rx_content_length %lld\n",(plVar2->swsi->http).rx_content_length);
    }
    buf[0xfc] = '\0';
    buf[0xfd] = '\0';
    buf[0xfe] = '\0';
    buf[0xff] = '\0';
    do {
      puVar7 = lws_token_to_string(buf._252_4_);
      if (puVar7 == (uchar *)0x0) {
        buf._252_4_ = buf._252_4_ + 1;
      }
      else {
        buf._248_4_ = lws_hdr_total_length(plVar2->swsi,buf._252_4_);
        if ((buf._248_4_ == 0) || (0xff < (int)buf._248_4_)) {
          buf._252_4_ = buf._252_4_ + 1;
        }
        else {
          iVar3 = lws_hdr_copy(plVar2->swsi,(char *)&c,0x100,buf._252_4_);
          if (iVar3 < 0) {
            _lws_log(8,"    %s !oversize!\n",puVar7);
          }
          else {
            buf[0xf7] = '\0';
            _lws_log(8,"    %s = %s\n",puVar7,&c);
          }
          buf._252_4_ = buf._252_4_ + 1;
        }
      }
    } while (puVar7 != (uchar *)0x0);
    if (((plVar2->swsi->h2).h2_state == '\x04') || ((plVar2->swsi->h2).h2_state == '\x06')) {
      lws_h2_goaway(wsi,5,"Banning service on CLOSED_REMOTE");
      return 0;
    }
    uVar1 = (plVar2->swsi->h2).h2_state;
    if (uVar1 == '\x03') {
      if (((plVar2->swsi->h2).field_0x11 & 1) != 0) {
        lws_h2_state(plVar2->swsi,LWS_H2_STATE_HALF_CLOSED_REMOTE);
      }
    }
    else if ((uVar1 == '\x05') && (((plVar2->swsi->h2).field_0x11 & 1) != 0)) {
      lws_h2_state(plVar2->swsi,LWS_H2_STATE_CLOSED);
    }
    if ((*(ulong *)&plVar2->swsi->field_0x2dc >> 0x37 & 1) != 0) {
      _lws_log(8,"%s: headers: client path\n","lws_h2_parse_end_of_frame");
      return 0;
    }
    iVar3 = lws_hdr_total_length(plVar2->swsi,WSI_TOKEN_HTTP_COLON_PATH);
    if ((((iVar3 == 0) ||
         (iVar3 = lws_hdr_total_length(plVar2->swsi,WSI_TOKEN_HTTP_COLON_METHOD), iVar3 == 0)) ||
        (iVar3 = lws_hdr_total_length(plVar2->swsi,WSI_TOKEN_HTTP_COLON_SCHEME), iVar3 == 0)) ||
       ((iVar3 = lws_hdr_total_length(plVar2->swsi,WSI_TOKEN_HTTP_COLON_STATUS), iVar3 != 0 ||
        (iVar3 = lws_hdr_extant(plVar2->swsi,WSI_TOKEN_CONNECTION), iVar3 != 0)))) {
      lws_h2_goaway(wsi,1,"Pseudoheader checks");
      return 0;
    }
    iVar3 = lws_hdr_extant(plVar2->swsi,WSI_TOKEN_TE);
    if (iVar3 == 0) {
LAB_00147f2e:
      pcVar5 = lws_hdr_simple_ptr(plVar2->swsi,WSI_TOKEN_HTTP_COLON_METHOD);
      for (pps._4_4_ = 0; pps._4_4_ < 8; pps._4_4_ = pps._4_4_ + 1) {
        iVar3 = strcasecmp(pcVar5,method_names[pps._4_4_]);
        if (iVar3 == 0) {
          ((plVar2->swsi->http).ah)->frag_index[method_index[pps._4_4_]] =
               ((plVar2->swsi->http).ah)->frag_index[0x25];
          break;
        }
      }
      _lws_log(0x10,"%s: setting DEF_ACT from 0x%x\n","lws_h2_parse_end_of_frame",
               (ulong)plVar2->swsi->wsistate);
      lwsi_set_state(plVar2->swsi,0x110);
      lws_callback_on_writable(plVar2->swsi);
    }
    else {
      iVar3 = lws_hdr_total_length(plVar2->swsi,WSI_TOKEN_TE);
      if (iVar3 == 8) {
        pcVar5 = lws_hdr_simple_ptr(plVar2->swsi,WSI_TOKEN_TE);
        iVar3 = strncmp(pcVar5,"trailers",8);
        if (iVar3 == 0) goto LAB_00147f2e;
      }
      lws_h2_goaway(wsi,1,"Illegal transfer-encoding");
    }
    break;
  case '\x03':
    _lws_log(8,"LWS_H2_FRAME_TYPE_RST_STREAM: sid %u: reason 0x%x\n",(ulong)plVar2->sid,
             (ulong)plVar2->hpack_e_dep);
    break;
  case '\x04':
    if ((((*(ulong *)&wsi->field_0x2dc >> 0x36 & 1) != 0) &&
        ((*(ulong *)&wsi->field_0x2dc >> 0x38 & 1) == 0)) && ((plVar2->flags & 1) == 0)) {
      (wsi->http).fop_fd = (lws_fop_fd_t)0x0;
      _lws_log(8,"%s: migrating\n","lws_h2_parse_end_of_frame");
      *(ulong *)&wsi->field_0x2dc =
           *(ulong *)&wsi->field_0x2dc & 0xfeffffffffffffff | 0x100000000000000;
      plVar4 = lws_wsi_server_new(wsi->vhost,wsi,1);
      plVar2->swsi = plVar4;
      if (plVar2->swsi == (lws *)0x0) {
        return 1;
      }
      plVar2->sid = 1;
      plVar4 = lws_wsi_mux_from_id(wsi,1);
      if (plVar4 != plVar2->swsi) {
        __assert_fail("lws_wsi_mux_from_id(wsi, 1) == h2n->swsi",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/h2/http2.c"
                      ,0x56b,"int lws_h2_parse_end_of_frame(struct lws *)");
      }
      lws_role_transition(wsi,0x10000000,LRS_H2_WAITING_TO_SEND_HEADERS,&role_ops_h2);
      lws_role_transition(plVar2->swsi,0x10000000,LRS_H2_WAITING_TO_SEND_HEADERS,&role_ops_h2);
      (plVar2->swsi->http).ah = (wsi->http).ah;
      *(ulong *)&plVar2->swsi->field_0x2dc =
           *(ulong *)&plVar2->swsi->field_0x2dc & 0xff7fffffffffffff | 0x80000000000000;
      plVar2->swsi->flags = wsi->flags;
      plVar2->swsi->protocol = wsi->protocol;
      if ((plVar2->swsi->user_space != (void *)0x0) &&
         ((*(ulong *)&plVar2->swsi->field_0x2dc >> 0xb & 1) == 0)) {
        lws_realloc(plVar2->swsi->user_space,0,"lws_free");
      }
      plVar2->swsi->user_space = wsi->user_space;
      *(ulong *)&plVar2->swsi->field_0x2dc =
           *(ulong *)&plVar2->swsi->field_0x2dc & 0xfffffffffffff7ff |
           (ulong)((uint)(*(ulong *)&wsi->field_0x2dc >> 0xb) & 1) << 0xb;
      plVar2->swsi->opaque_user_data = wsi->opaque_user_data;
      wsi->opaque_user_data = (void *)0x0;
      (plVar2->swsi->txc).manual_initial_tx_credit = (wsi->txc).manual_initial_tx_credit;
      wsi->user_space = (void *)0x0;
      if ((plVar2->swsi->http).ah != (allocated_headers *)0x0) {
        ((plVar2->swsi->http).ah)->wsi = plVar2->swsi;
      }
      (wsi->http).ah = (allocated_headers *)0x0;
      _lws_log(8,"%s: MIGRATING nwsi %p: swsi %p\n","lws_h2_parse_end_of_frame",wsi,plVar2->swsi);
      (plVar2->swsi->txc).tx_cr = (plVar2->peer_set).s[4];
      _lws_log(8,"%s: initial tx credit on conn %p: %d\n","lws_h2_parse_end_of_frame",plVar2->swsi,
               (ulong)(uint)(plVar2->swsi->txc).tx_cr);
      (plVar2->swsi->h2).field_0x11 = (plVar2->swsi->h2).field_0x11 & 0xef | 0x10;
      if (((byte)(wsi->h2).field_0x11 >> 4 & 1) == 0) {
        (wsi->txc).tx_cr = (plVar2->peer_set).s[4];
        _lws_log(8,"%s: initial tx credit for us to write on master %p: %d\n",
                 "lws_h2_parse_end_of_frame",wsi,(ulong)(uint)(wsi->txc).tx_cr);
        (wsi->h2).field_0x11 = (wsi->h2).field_0x11 & 0xef | 0x10;
      }
      lws_callback_on_writable(plVar2->swsi);
      if (((*(ulong *)&wsi->field_0x2dc >> 6 & 1) == 0) || ((wsi->flags & 0x20U) == 0)) {
        plVar8 = lws_h2_new_pps(LWS_H2_PPS_ACK_SETTINGS);
        if (plVar8 == (lws_h2_protocol_send *)0x0) {
          return 1;
        }
        lws_pps_schedule(wsi,plVar8);
        _lws_log(8,"%s: SETTINGS ack PPS\n","lws_h2_parse_end_of_frame");
        *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffffffffbf | 0x40;
      }
      lws_wsi_mux_apply_queue(wsi);
    }
    break;
  case '\x06':
    if ((plVar2->flags & 1) == 0) {
      plVar8 = lws_h2_new_pps(LWS_H2_PPS_PONG);
      if (plVar8 == (lws_h2_protocol_send *)0x0) {
        return 1;
      }
      _lws_log(8,"rx ping, preparing pong\n");
      (plVar8->u).rs = *(anon_struct_8_2_43e7303c_for_rs *)plVar2->ping_payload;
      lws_pps_schedule(wsi,plVar8);
    }
    else {
      lws_validity_confirmed(wsi);
    }
    break;
  case '\a':
    _lws_log(4,"GOAWAY: last sid %u, error 0x%08X, string \'%s\'\n",(ulong)plVar2->goaway_last_sid,
             (ulong)plVar2->goaway_err,plVar2->goaway_str);
    return 1;
  case '\b':
    plVar2->hpack_e_dep = plVar2->hpack_e_dep & 0x7fffffff;
    _lws_log(8,"WINDOW_UPDATE: sid %u %u (0x%x)\n",(ulong)plVar2->sid,(ulong)plVar2->hpack_e_dep,
             (ulong)plVar2->hpack_e_dep);
    p = (char *)wsi;
    if (plVar2->sid != 0) {
      p = (char *)plVar2->swsi;
    }
    if (p == (char *)0x0) {
      if (plVar2->highest_sid_opened < plVar2->sid) {
        lws_h2_goaway(wsi,1,"alien sid");
      }
    }
    else {
      if (((*(ulong *)(*(long *)(p + 0x200) + 0x140) & 0x80000000) != 0) &&
         (0x7fffffff < (long)*(int *)(p + 0xe0) + (ulong)plVar2->hpack_e_dep)) {
        plVar2->hpack_e_dep = 0x7fffffff - *(int *)(p + 0xe0);
      }
      if ((long)*(int *)(p + 0xe0) + (ulong)plVar2->hpack_e_dep < 0x80000000) {
        if (plVar2->hpack_e_dep == 0) {
          lws_h2_goaway(wsi,1,"Zero length window update");
        }
        else {
          iVar3 = *(int *)(p + 0xe0);
          *(uint32_t *)(p + 0xe0) = plVar2->hpack_e_dep + *(int *)(p + 0xe0);
          lws_wsi_txc_report_manual_txcr_in((lws *)p,plVar2->hpack_e_dep);
          lws_wsi_txc_describe
                    ((lws_tx_credit *)(p + 0xe0),"WINDOW_UPDATE in",*(uint32_t *)(p + 0xd0));
          if ((0 < iVar3) || (0 < *(int *)(p + 0xe0))) {
            for (local_160 = (wsi->mux).child_list; local_160 != (lws *)0x0;
                local_160 = (local_160->mux).sibling_list) {
              lws_callback_on_writable(local_160);
            }
            if (p[0xec] != '\0') {
              iVar3 = lws_h2_tx_cr_get((lws *)p);
              iVar3 = lws_wsi_txc_check_skint((lws_tx_credit *)(p + 0xe0),iVar3);
              if (iVar3 == 0) {
                lws_callback_on_writable((lws *)p);
              }
            }
          }
        }
      }
      else if (plVar2->sid == 0) {
        lws_h2_goaway(wsi,3,"Flow control exceeded max");
      }
      else {
        lws_h2_rst_stream(plVar2->swsi,3,"Flow control exceeded max");
      }
    }
    break;
  case '\n':
  }
  return 0;
}

Assistant:

static int
lws_h2_parse_end_of_frame(struct lws *wsi)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws *eff_wsi = wsi;
	const char *p;
	int n;

	h2n->frame_state = 0;
	h2n->count = 0;

	if (h2n->sid)
		h2n->swsi = lws_wsi_mux_from_id(wsi, h2n->sid);

	if (h2n->sid > h2n->highest_sid)
		h2n->highest_sid = h2n->sid;

	if (h2n->collected_priority && (h2n->dep & ~(1u << 31)) == h2n->sid) {
		lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR, "depends on own sid");
		return 0;
	}

	switch (h2n->type) {

	case LWS_H2_FRAME_TYPE_SETTINGS:

#if defined(LWS_WITH_CLIENT)
		if (wsi->client_h2_alpn && !wsi->client_mux_migrated &&
		    !(h2n->flags & LWS_H2_FLAG_SETTINGS_ACK)) {
			struct lws_h2_protocol_send *pps;

			/* migrate original client ask on to substream 1 */
#if defined(LWS_WITH_FILE_OPS)
			wsi->http.fop_fd = NULL;
#endif
			lwsl_info("%s: migrating\n", __func__);
			wsi->client_mux_migrated = 1;
			/*
			 * we need to treat the headers from the upgrade as the
			 * first job.  So these need to get shifted to sid 1.
			 */
			h2n->swsi = lws_wsi_server_new(wsi->vhost, wsi, 1);
			if (!h2n->swsi)
				return 1;
			h2n->sid = 1;

			assert(lws_wsi_mux_from_id(wsi, 1) == h2n->swsi);

			lws_role_transition(wsi, LWSIFR_CLIENT,
					    LRS_H2_WAITING_TO_SEND_HEADERS,
					    &role_ops_h2);

			lws_role_transition(h2n->swsi, LWSIFR_CLIENT,
					    LRS_H2_WAITING_TO_SEND_HEADERS,
					    &role_ops_h2);

			/* pass on the initial headers to SID 1 */
			h2n->swsi->http.ah = wsi->http.ah;
			h2n->swsi->client_mux_substream = 1;
#if defined(LWS_WITH_CLIENT)
			h2n->swsi->flags = wsi->flags;
#endif

			h2n->swsi->protocol = wsi->protocol;
			if (h2n->swsi->user_space &&
			    !h2n->swsi->user_space_externally_allocated)
				lws_free(h2n->swsi->user_space);
			h2n->swsi->user_space = wsi->user_space;
			h2n->swsi->user_space_externally_allocated =
					wsi->user_space_externally_allocated;
			h2n->swsi->opaque_user_data = wsi->opaque_user_data;
			wsi->opaque_user_data = NULL;
			h2n->swsi->txc.manual_initial_tx_credit =
					wsi->txc.manual_initial_tx_credit;

			wsi->user_space = NULL;

			if (h2n->swsi->http.ah)
				h2n->swsi->http.ah->wsi = h2n->swsi;
			wsi->http.ah = NULL;

			lwsl_info("%s: MIGRATING nwsi %p: swsi %p\n", __func__,
				  wsi, h2n->swsi);
			h2n->swsi->txc.tx_cr =
				h2n->peer_set.s[H2SET_INITIAL_WINDOW_SIZE];
			lwsl_info("%s: initial tx credit on conn %p: %d\n",
				  __func__, h2n->swsi, (int)h2n->swsi->txc.tx_cr);
			h2n->swsi->h2.initialized = 1;

			/* set our initial window size */
			if (!wsi->h2.initialized) {
				wsi->txc.tx_cr =
				     h2n->peer_set.s[H2SET_INITIAL_WINDOW_SIZE];

				lwsl_info("%s: initial tx credit for us to "
					  "write on master %p: %d\n", __func__,
					  wsi, (int)wsi->txc.tx_cr);
				wsi->h2.initialized = 1;
			}

			lws_callback_on_writable(h2n->swsi);

			if (!wsi->h2_acked_settings ||
			    !(wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM)
			) {
				pps = lws_h2_new_pps(LWS_H2_PPS_ACK_SETTINGS);
				if (!pps)
					return 1;
				lws_pps_schedule(wsi, pps);
				lwsl_info("%s: SETTINGS ack PPS\n", __func__);
				wsi->h2_acked_settings = 1;
			}

			/* also attach any queued guys */

			lws_wsi_mux_apply_queue(wsi);
		}
#endif
		break;

	case LWS_H2_FRAME_TYPE_CONTINUATION:
	case LWS_H2_FRAME_TYPE_HEADERS:

		if (!h2n->swsi)
			break;

		/* service the http request itself */

		if (h2n->last_action_dyntable_resize) {
			lws_h2_goaway(wsi, H2_ERR_COMPRESSION_ERROR,
				"dyntable resize last in headers");
			break;
		}

		if (!h2n->swsi->h2.END_HEADERS) {
			/* we are not finished yet */
			lwsl_info("witholding http action for continuation\n");
			h2n->cont_exp_sid = h2n->sid;
			h2n->cont_exp = 1;
			break;
		}

		/* confirm the hpack stream state is reasonable for finishing */

		if (h2n->hpack != HPKS_TYPE) {
			/* hpack incomplete */
			lwsl_info("hpack incomplete %d (type %d, len %u)\n",
				  h2n->hpack, h2n->type,
				  (unsigned int)h2n->hpack_len);
			lws_h2_goaway(wsi, H2_ERR_COMPRESSION_ERROR,
				      "hpack incomplete");
			break;
		}

		/* this is the last part of HEADERS */
		switch (h2n->swsi->h2.h2_state) {
		case LWS_H2_STATE_IDLE:
			lws_h2_state(h2n->swsi, LWS_H2_STATE_OPEN);
			break;
		case LWS_H2_STATE_RESERVED_REMOTE:
			lws_h2_state(h2n->swsi, LWS_H2_STATE_HALF_CLOSED_LOCAL);
			break;
		}

		lwsl_info("http req, wsi=%p, h2n->swsi=%p\n", wsi, h2n->swsi);
		h2n->swsi->hdr_parsing_completed = 1;

#if defined(LWS_WITH_CLIENT)
		if (h2n->swsi->client_mux_substream &&
		    lws_client_interpret_server_handshake(h2n->swsi)) {
			lwsl_info("%s: cli int serv hs closed it\n", __func__);
			break;
		}
#endif

		if (lws_hdr_extant(h2n->swsi, WSI_TOKEN_HTTP_CONTENT_LENGTH)) {
			h2n->swsi->http.rx_content_length  = atoll(
				lws_hdr_simple_ptr(h2n->swsi,
				      WSI_TOKEN_HTTP_CONTENT_LENGTH));
			h2n->swsi->http.rx_content_remain =
					h2n->swsi->http.rx_content_length;
			lwsl_info("setting rx_content_length %lld\n",
				  (long long)h2n->swsi->http.rx_content_length);
		}

		{
			int n = 0, len;
			char buf[256];
			const unsigned char *c;

			do {
				c = lws_token_to_string(n);
				if (!c) {
					n++;
					continue;
				}

				len = lws_hdr_total_length(h2n->swsi, n);
				if (!len || len > (int)sizeof(buf) - 1) {
					n++;
					continue;
				}

				if (lws_hdr_copy(h2n->swsi, buf, sizeof buf,
						 n) < 0) {
					lwsl_info("    %s !oversize!\n",
						  (char *)c);
				} else {
					buf[sizeof(buf) - 1] = '\0';

					lwsl_info("    %s = %s\n",
						  (char *)c, buf);
				}
				n++;
			} while (c);
		}

		if (h2n->swsi->h2.h2_state == LWS_H2_STATE_HALF_CLOSED_REMOTE ||
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_CLOSED) {
			lws_h2_goaway(wsi, H2_ERR_STREAM_CLOSED,
				      "Banning service on CLOSED_REMOTE");
			break;
		}

		switch (h2n->swsi->h2.h2_state) {
		case LWS_H2_STATE_OPEN:
			if (h2n->swsi->h2.END_STREAM)
				lws_h2_state(h2n->swsi,
					     LWS_H2_STATE_HALF_CLOSED_REMOTE);
			break;
		case LWS_H2_STATE_HALF_CLOSED_LOCAL:
			if (h2n->swsi->h2.END_STREAM)
				lws_h2_state(h2n->swsi, LWS_H2_STATE_CLOSED);
			break;
		}

#if defined(LWS_WITH_CLIENT)
		if (h2n->swsi->client_mux_substream) {
			lwsl_info("%s: headers: client path\n", __func__);
			break;
		}
#endif

		if (!lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_PATH) ||
		    !lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_METHOD) ||
		    !lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_SCHEME) ||
		     lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_STATUS) ||
		     lws_hdr_extant(h2n->swsi, WSI_TOKEN_CONNECTION)) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "Pseudoheader checks");
			break;
		}

		if (lws_hdr_extant(h2n->swsi, WSI_TOKEN_TE)) {
			n = lws_hdr_total_length(h2n->swsi, WSI_TOKEN_TE);

			if (n != 8 ||
			    strncmp(lws_hdr_simple_ptr(h2n->swsi, WSI_TOKEN_TE),
				  "trailers", n)) {
				lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
					      "Illegal transfer-encoding");
				break;
			}
		}

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
		lws_http_compression_validate(h2n->swsi);
#endif

#if defined(LWS_WITH_SERVER_STATUS)
		wsi->vhost->conn_stats.h2_trans++;
#endif
		p = lws_hdr_simple_ptr(h2n->swsi, WSI_TOKEN_HTTP_COLON_METHOD);
		/*
		 * duplicate :path into the individual method uri header
		 * index, so that it looks the same as h1 in the ah
		 */
		for (n = 0; n < (int)LWS_ARRAY_SIZE(method_names); n++)
			if (!strcasecmp(p, method_names[n])) {
				h2n->swsi->http.ah->frag_index[method_index[n]] =
						h2n->swsi->http.ah->frag_index[
				                     WSI_TOKEN_HTTP_COLON_PATH];
				break;
			}

		lwsl_debug("%s: setting DEF_ACT from 0x%x\n", __func__,
			   (unsigned int)h2n->swsi->wsistate);
		lwsi_set_state(h2n->swsi, LRS_DEFERRING_ACTION);
		lws_callback_on_writable(h2n->swsi);
		break;

	case LWS_H2_FRAME_TYPE_DATA:
		lwsl_info("%s: DATA flags 0x%x\n", __func__, h2n->flags);
		if (!h2n->swsi)
			break;

		if (lws_hdr_total_length(h2n->swsi,
					 WSI_TOKEN_HTTP_CONTENT_LENGTH) &&
		    h2n->swsi->h2.END_STREAM &&
		    h2n->swsi->http.rx_content_length &&
		    h2n->swsi->http.rx_content_remain) {
			lws_h2_rst_stream(h2n->swsi, H2_ERR_PROTOCOL_ERROR,
					  "Not enough rx content");
			break;
		}

		if (h2n->swsi->h2.END_STREAM &&
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_OPEN)
			lws_h2_state(h2n->swsi,
				     LWS_H2_STATE_HALF_CLOSED_REMOTE);

		if (h2n->swsi->h2.END_STREAM &&
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_HALF_CLOSED_LOCAL)
			lws_h2_state(h2n->swsi, LWS_H2_STATE_CLOSED);

#if defined(LWS_WITH_CLIENT)
		/*
		 * client... remote END_STREAM implies we weren't going to
		 * send anything else anyway.
		 */

		if (h2n->swsi->client_mux_substream &&
		    (h2n->flags & LWS_H2_FLAG_END_STREAM)) {
			lwsl_info("%s: %p: DATA: end stream\n",
				  __func__, h2n->swsi);

			if (h2n->swsi->h2.h2_state == LWS_H2_STATE_OPEN) {
				lws_h2_state(h2n->swsi,
					     LWS_H2_STATE_HALF_CLOSED_REMOTE);
		//		lws_h2_rst_stream(h2n->swsi, H2_ERR_NO_ERROR,
		//				  "client done");

		//		if (lws_http_transaction_completed_client(h2n->swsi))
		//			lwsl_debug("tx completed returned close\n");
			}

			//if (h2n->swsi->h2.h2_state == LWS_H2_STATE_HALF_CLOSED_LOCAL)
			{
				lws_h2_state(h2n->swsi, LWS_H2_STATE_CLOSED);

				lws_h2_rst_stream(h2n->swsi, H2_ERR_NO_ERROR,
						  "client done");

				if (lws_http_transaction_completed_client(h2n->swsi))
					lwsl_debug("tx completed returned close\n");
			}
		}
#endif
		break;

	case LWS_H2_FRAME_TYPE_PING:
		if (h2n->flags & LWS_H2_FLAG_SETTINGS_ACK)
			lws_validity_confirmed(wsi);
		else {
			/* they're sending us a ping request */
			struct lws_h2_protocol_send *pps =
					lws_h2_new_pps(LWS_H2_PPS_PONG);
			if (!pps)
				return 1;

			lwsl_info("rx ping, preparing pong\n");

			memcpy(pps->u.ping.ping_payload, h2n->ping_payload, 8);
			lws_pps_schedule(wsi, pps);
		}

		break;

	case LWS_H2_FRAME_TYPE_WINDOW_UPDATE:
		/*
		 * We only have an unsigned 31-bit (positive) increment possible
		 */
		h2n->hpack_e_dep &= ~(1u << 31);
		lwsl_info("WINDOW_UPDATE: sid %u %u (0x%x)\n",
			  (unsigned int)h2n->sid,
			  (unsigned int)h2n->hpack_e_dep,
			  (unsigned int)h2n->hpack_e_dep);

		if (h2n->sid)
			eff_wsi = h2n->swsi;

		if (!eff_wsi) {
			if (h2n->sid > h2n->highest_sid_opened)
				lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
					      "alien sid");
			break; /* ignore */
		}

		if (eff_wsi->vhost->options &
		        LWS_SERVER_OPTION_H2_JUST_FIX_WINDOW_UPDATE_OVERFLOW &&
		    (uint64_t)eff_wsi->txc.tx_cr + (uint64_t)h2n->hpack_e_dep >
		    (uint64_t)0x7fffffff)
			h2n->hpack_e_dep = 0x7fffffff - eff_wsi->txc.tx_cr;

		if ((uint64_t)eff_wsi->txc.tx_cr + (uint64_t)h2n->hpack_e_dep >
		    (uint64_t)0x7fffffff) {
			if (h2n->sid)
				lws_h2_rst_stream(h2n->swsi,
						  H2_ERR_FLOW_CONTROL_ERROR,
						  "Flow control exceeded max");
			else
				lws_h2_goaway(wsi, H2_ERR_FLOW_CONTROL_ERROR,
					      "Flow control exceeded max");
			break;
		}

		if (!h2n->hpack_e_dep) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "Zero length window update");
			break;
		}
		n = eff_wsi->txc.tx_cr;
		eff_wsi->txc.tx_cr += h2n->hpack_e_dep;

		lws_wsi_txc_report_manual_txcr_in(eff_wsi,
						  (int32_t)h2n->hpack_e_dep);

		lws_wsi_txc_describe(&eff_wsi->txc, "WINDOW_UPDATE in",
				     eff_wsi->mux.my_sid);

		if (n <= 0 && eff_wsi->txc.tx_cr <= 0)
			/* it helps, but won't change sendability for anyone */
			break;

		/*
		 * It may have changed sendability (depends on SID 0 tx credit
		 * too)... for us and any children waiting on us... reassess
		 * blockage for all children first
		 */
		lws_start_foreach_ll(struct lws *, w, wsi->mux.child_list) {
			lws_callback_on_writable(w);
		} lws_end_foreach_ll(w, mux.sibling_list);

		if (eff_wsi->txc.skint &&
		    !lws_wsi_txc_check_skint(&eff_wsi->txc,
					     lws_h2_tx_cr_get(eff_wsi)))
			/*
			 * This one became un-skint, schedule a writeable
			 * callback
			 */
			lws_callback_on_writable(eff_wsi);

		break;

	case LWS_H2_FRAME_TYPE_GOAWAY:
		lwsl_notice("GOAWAY: last sid %u, error 0x%08X, string '%s'\n",
			  (unsigned int)h2n->goaway_last_sid,
			  (unsigned int)h2n->goaway_err, h2n->goaway_str);

		return 1;

	case LWS_H2_FRAME_TYPE_RST_STREAM:
		lwsl_info("LWS_H2_FRAME_TYPE_RST_STREAM: sid %u: reason 0x%x\n",
			  (unsigned int)h2n->sid,
			  (unsigned int)h2n->hpack_e_dep);
		break;

	case LWS_H2_FRAME_TYPE_COUNT: /* IGNORING FRAME */
		break;
	}

	return 0;
}